

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HMAC.c
# Opt level: O3

void EverCrypt_HMAC_compute_sha2_512
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  uint uVar1;
  uint uVar2;
  undefined1 totlen [16];
  undefined1 totlen_00 [16];
  long lVar3;
  uint uVar4;
  uint32_t len;
  uint64_t *hash;
  undefined8 uVar5;
  undefined8 uVar6;
  uint local_188 [64];
  uint64_t local_88 [9];
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_188[0x3c] = 0;
  local_188[0x3d] = 0;
  local_188[0x3e] = 0;
  local_188[0x3f] = 0;
  local_188[0x38] = 0;
  local_188[0x39] = 0;
  local_188[0x3a] = 0;
  local_188[0x3b] = 0;
  local_188[0x34] = 0;
  local_188[0x35] = 0;
  local_188[0x36] = 0;
  local_188[0x37] = 0;
  local_188[0x30] = 0;
  local_188[0x31] = 0;
  local_188[0x32] = 0;
  local_188[0x33] = 0;
  local_188[0x2c] = 0;
  local_188[0x2d] = 0;
  local_188[0x2e] = 0;
  local_188[0x2f] = 0;
  local_188[0x28] = 0;
  local_188[0x29] = 0;
  local_188[0x2a] = 0;
  local_188[0x2b] = 0;
  local_188[0x24] = 0;
  local_188[0x25] = 0;
  local_188[0x26] = 0;
  local_188[0x27] = 0;
  local_188[0x20] = 0;
  local_188[0x21] = 0;
  local_188[0x22] = 0;
  local_188[0x23] = 0;
  if (key_len < 0x81) {
    local_188[0x1e] = 0x173ddb;
    local_188[0x1f] = 0;
    memcpy(local_188 + 0x20,key,(ulong)key_len);
  }
  else {
    local_188[0x1e] = 0x173de9;
    local_188[0x1f] = 0;
    Hacl_Hash_SHA2_hash_512((uint8_t *)(local_188 + 0x20),key,key_len);
  }
  local_188[0x1c] = 0x36363636;
  local_188[0x1d] = 0x36363636;
  local_188[0x1e] = 0x36363636;
  local_188[0x1f] = 0x36363636;
  local_188[0x18] = 0x36363636;
  local_188[0x19] = 0x36363636;
  local_188[0x1a] = 0x36363636;
  local_188[0x1b] = 0x36363636;
  local_188[0x14] = 0x36363636;
  local_188[0x15] = 0x36363636;
  local_188[0x16] = 0x36363636;
  local_188[0x17] = 0x36363636;
  local_188[0x10] = 0x36363636;
  local_188[0x11] = 0x36363636;
  local_188[0x12] = 0x36363636;
  local_188[0x13] = 0x36363636;
  local_188[0xc] = 0x36363636;
  local_188[0xd] = 0x36363636;
  local_188[0xe] = 0x36363636;
  local_188[0xf] = 0x36363636;
  local_188[8] = 0x36363636;
  local_188[9] = 0x36363636;
  local_188[10] = 0x36363636;
  local_188[0xb] = 0x36363636;
  local_188[4] = 0x36363636;
  local_188[5] = 0x36363636;
  local_188[6] = 0x36363636;
  local_188[7] = 0x36363636;
  local_188[0] = 0x36363636;
  local_188[1] = 0x36363636;
  local_188[2] = 0x36363636;
  local_188[3] = 0x36363636;
  lVar3 = 0;
  do {
    *(uint *)((long)local_188 + lVar3) =
         *(uint *)((long)local_188 + lVar3 + 0x80) ^ *(uint *)((long)local_188 + lVar3);
    *(uint *)((long)local_188 + lVar3 + 4) =
         *(uint *)((long)local_188 + lVar3 + 0x84) ^ *(uint *)((long)local_188 + lVar3 + 4);
    *(uint *)((long)local_188 + lVar3 + 8) =
         *(uint *)((long)local_188 + lVar3 + 0x88) ^ *(uint *)((long)local_188 + lVar3 + 8);
    *(uint *)((long)local_188 + lVar3 + 0xc) =
         *(uint *)((long)local_188 + lVar3 + 0x8c) ^ *(uint *)((long)local_188 + lVar3 + 0xc);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x80);
  uVar5 = 0x5c5c5c5c5c5c5c5c;
  uVar6 = 0x5c5c5c5c5c5c5c5c;
  lVar3 = 0;
  do {
    uVar4 = *(uint *)((long)local_188 + lVar3 + 0x84);
    uVar1 = *(uint *)((long)local_188 + lVar3 + 0x88);
    uVar2 = *(uint *)((long)local_188 + lVar3 + 0x8c);
    *(uint *)(&stack0xfffffffffffffdf8 + lVar3) =
         *(uint *)((long)local_188 + lVar3 + 0x80) ^ *(uint *)(&stack0xfffffffffffffdf8 + lVar3);
    *(uint *)(&stack0xfffffffffffffdfc + lVar3) =
         uVar4 ^ *(uint *)(&stack0xfffffffffffffdfc + lVar3);
    *(uint *)(&stack0xfffffffffffffe00 + lVar3) =
         uVar1 ^ *(uint *)(&stack0xfffffffffffffe00 + lVar3);
    *(uint *)(&stack0xfffffffffffffe04 + lVar3) =
         uVar2 ^ *(uint *)(&stack0xfffffffffffffe04 + lVar3);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x80);
  local_88[0] = 0x6a09e667f3bcc908;
  local_88[1] = 0xbb67ae8584caa73b;
  local_88[2] = 0x3c6ef372fe94f82b;
  local_88[3] = 0xa54ff53a5f1d36f1;
  local_88[4] = 0x510e527fade682d1;
  local_88[5] = 0x9b05688c2b3e6c1f;
  local_88[6] = 0x1f83d9abfb41bd6b;
  local_88[7] = 0x5be0cd19137e2179;
  if (data_len == 0) {
    len = 0x80;
    hash = (uint64_t *)0x80;
  }
  else {
    uVar4 = (data_len >> 7) - 1;
    uVar1 = data_len + uVar4 * -0x80;
    if (data_len < 0x80 || (data_len & 0x7f) != 0) {
      uVar1 = data_len & 0x7f;
      uVar4 = data_len >> 7;
    }
    hash = (uint64_t *)(ulong)uVar1;
    uVar4 = uVar4 * 0x80;
    local_38 = data + uVar4;
    local_40 = dst;
    Hacl_Hash_SHA2_sha512_update_nblocks(0x80,(uint8_t *)local_188,local_88);
    Hacl_Hash_SHA2_sha512_update_nblocks(uVar4,data,local_88);
    len = uVar4 + uVar1 + 0x80;
    dst = local_40;
  }
  totlen._8_8_ = uVar6;
  totlen._0_8_ = uVar5;
  Hacl_Hash_SHA2_sha512_update_last((FStar_UInt128_uint128)totlen,len,(uint8_t *)0x0,hash);
  Hacl_Hash_SHA2_sha512_finish(local_88,(uint8_t *)local_188);
  Hacl_Hash_SHA2_sha512_init(local_88);
  Hacl_Hash_SHA2_sha512_update_nblocks(0x80,&stack0xfffffffffffffdf8,local_88);
  Hacl_Hash_SHA2_sha512_update_nblocks(0,(uint8_t *)local_188,local_88);
  totlen_00._8_8_ = uVar6;
  totlen_00._0_8_ = uVar5;
  Hacl_Hash_SHA2_sha512_update_last
            ((FStar_UInt128_uint128)totlen_00,0xc0,(uint8_t *)0x0,(uint64_t *)0x40);
  Hacl_Hash_SHA2_sha512_finish(local_88,dst);
  return;
}

Assistant:

void
EverCrypt_HMAC_compute_sha2_512(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_SHA2_hash_512(nkey, key, key_len);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t st[8U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t *os = st;
    uint64_t x = Hacl_Hash_SHA2_h512[i];
    os[i] = x;);
  uint64_t *s = st;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(0ULL),
        FStar_UInt128_uint64_to_uint128((uint64_t)128U)),
      128U,
      ipad,
      s);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    Hacl_Hash_SHA2_sha512_update_nblocks(128U, ipad, s);
    Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
          FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
        FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
      rem_len,
      rem,
      s);
  }
  Hacl_Hash_SHA2_sha512_finish(s, dst1);
  uint8_t *hash1 = ipad;
  Hacl_Hash_SHA2_sha512_init(s);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  Hacl_Hash_SHA2_sha512_update_nblocks(128U, opad, s);
  Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
  Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
    rem_len,
    rem,
    s);
  Hacl_Hash_SHA2_sha512_finish(s, dst);
}